

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::Set<google::protobuf::strings::Hex>
          (Formatter *this,string *key,Hex *value)

{
  Hex x;
  mapped_type *this_00;
  undefined8 in_RDX;
  string local_38 [16];
  key_type *in_stack_ffffffffffffffd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffe0;
  
  x._8_8_ = in_RDX;
  x.value = (uint64)in_stack_ffffffffffffffe0;
  ToString_abi_cxx11_(x);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::__cxx11::string::operator=((string *)this_00,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Set(const std::string& key, const T& value) {
    vars_[key] = ToString(value);
  }